

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnSurfaceProjection.h
# Opt level: O2

ParameterPoint * __thiscall
anurbs::PointOnSurfaceProjection<3L>::triangle_projection
          (ParameterPoint *__return_storage_ptr__,PointOnSurfaceProjection<3L> *this,Vector *point,
          size_t *index_a,size_t *index_b,size_t *index_c)

{
  pointer pPVar1;
  size_t sVar2;
  ResScalar RVar3;
  ResScalar RVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  Vector v;
  value_type c;
  value_type b;
  Vector w;
  Vector u;
  value_type a;
  double dStack_150;
  Vector *local_138;
  undefined8 *puStack_130;
  double local_128;
  undefined8 *local_118;
  undefined8 *puStack_110;
  double local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  undefined8 local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8;
  double dStack_b0;
  undefined8 local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double local_80;
  double dStack_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  pPVar1 = (this->m_tessellation).
           super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = *index_a;
  local_58 = pPVar1[sVar2].parameter_u;
  dStack_50 = pPVar1[sVar2].parameter_v;
  local_38 = pPVar1[sVar2].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[2];
  local_48 = *(undefined8 *)
              &pPVar1[sVar2].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
               m_storage;
  dStack_40 = pPVar1[sVar2].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage.m_data.array[1];
  sVar2 = *index_b;
  local_b8 = pPVar1[sVar2].parameter_u;
  dStack_b0 = pPVar1[sVar2].parameter_v;
  local_100 = &local_a8;
  local_a8 = *(undefined8 *)
              &pPVar1[sVar2].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
               m_storage;
  dStack_a0 = pPVar1[sVar2].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage.m_data.array[1];
  local_98 = pPVar1[sVar2].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[2];
  sVar2 = *index_c;
  local_e8 = pPVar1[sVar2].parameter_u;
  dStack_e0 = pPVar1[sVar2].parameter_v;
  local_d8 = *(undefined8 *)
              &pPVar1[sVar2].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
               m_storage;
  dStack_d0 = pPVar1[sVar2].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage.m_data.array[1];
  local_c8 = pPVar1[sVar2].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[2];
  local_f8 = &local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_70,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)&local_100);
  local_118 = &local_d8;
  puStack_110 = &local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_100,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)&local_118);
  local_118 = (undefined8 *)(dStack_f0 * local_68 - dStack_60 * (double)local_f8);
  puStack_110 = (undefined8 *)((double)local_100 * dStack_60 - local_70 * dStack_f0);
  local_108 = local_70 * (double)local_f8 - (double)local_100 * local_68;
  local_138 = point;
  puStack_130 = &local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_88,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)&local_138);
  local_138 = (Vector *)(dStack_78 * local_68 - dStack_60 * local_80);
  puStack_130 = (undefined8 *)(local_88 * dStack_60 - local_70 * dStack_78);
  local_128 = local_70 * local_80 - local_88 * local_68;
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_138,
                (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_118);
  dVar6 = local_108;
  dVar11 = (double)local_118 * (double)local_118;
  auVar9._8_4_ = SUB84((double)puStack_110 * (double)puStack_110,0);
  auVar9._0_8_ = dVar11;
  auVar9._12_4_ = (int)((ulong)((double)puStack_110 * (double)puStack_110) >> 0x20);
  local_138 = (Vector *)(dStack_f0 * local_80 - dStack_78 * (double)local_f8);
  puStack_130 = (undefined8 *)((double)local_100 * dStack_78 - local_88 * dStack_f0);
  local_128 = local_88 * (double)local_f8 - (double)local_100 * local_80;
  RVar4 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_138,
                (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_118);
  dStack_150 = auVar9._8_8_;
  auVar8._8_8_ = RVar4;
  auVar8._0_8_ = RVar3;
  auVar5._8_8_ = local_108 * local_108 +
                 (double)puStack_110 * (double)puStack_110 + (double)local_118 * (double)local_118;
  auVar5._0_8_ = dVar6 * dVar6 + dStack_150 + dVar11;
  auVar9 = divpd(auVar8,auVar5);
  dVar6 = auVar9._0_8_;
  dVar10 = auVar9._8_8_;
  dVar11 = (1.0 - dVar6) - dVar10;
  dVar7 = dVar6 * local_e8 + dVar11 * local_58 + dVar10 * local_b8;
  dVar11 = dVar6 * dStack_e0 + dVar11 * dStack_50 + dVar10 * dStack_b0;
  (*((this->m_surface).super___shared_ptr<anurbs::SurfaceBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_SurfaceBase[6])(SUB84(dVar7,0),dVar11,&__return_storage_ptr__->point);
  __return_storage_ptr__->parameter_u = dVar7;
  __return_storage_ptr__->parameter_v = dVar11;
  return __return_storage_ptr__;
}

Assistant:

ParameterPoint triangle_projection(const Vector point,
        const size_t& index_a, const size_t& index_b, const size_t& index_c)
    {
        const auto a = m_tessellation[index_a];
        const auto b = m_tessellation[index_b];
        const auto c = m_tessellation[index_c];

        const Vector u = b.point - a.point;
        const Vector v = c.point - a.point;
        const Vector n = cross(u, v);
        const Vector w = point - a.point;

        const double gam = dot(cross(u, w), n) / squared_norm(n);
        const double bet = dot(cross(w, v), n) / squared_norm(n);
        const double alp = 1.0 - gam - bet;

        const double parameter_u = alp * a.parameter_u + bet * b.parameter_u +
            gam * c.parameter_u;
        const double parameter_v = alp * a.parameter_v + bet * b.parameter_v +
            gam * c.parameter_v;

        const Vector closest_point =
            m_surface->point_at(parameter_u, parameter_v);

        return {parameter_u, parameter_v, closest_point};
    }